

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

Map<String,_String> * Process::getEnvironmentVariables(void)

{
  usize *puVar1;
  long lVar2;
  long *plVar3;
  char cVar4;
  usize length;
  Map<String,_String> *in_RDI;
  long lVar5;
  char *str;
  long lVar6;
  String value;
  String var;
  String local_80;
  String local_58;
  
  (in_RDI->_end).item = &in_RDI->endItem;
  (in_RDI->_begin).item = &in_RDI->endItem;
  in_RDI->root = (Item *)0x0;
  in_RDI->_size = 0;
  (in_RDI->endItem).key.data = &String::emptyData.super_Data;
  (in_RDI->endItem).value.data = &String::emptyData.super_Data;
  (in_RDI->endItem).parent = (Item *)0x0;
  (in_RDI->endItem).next = (Item *)0x0;
  (in_RDI->endItem).prev = (Item *)0x0;
  in_RDI->freeItem = (Item *)0x0;
  in_RDI->blocks = (ItemBlock *)0x0;
  str = (char *)*_environ;
  if (str != (char *)0x0) {
    lVar6 = 0;
    plVar3 = _environ;
    do {
      cVar4 = *str;
      if (cVar4 != '\0') {
        lVar5 = 1;
LAB_001046e9:
        if (cVar4 != '=') goto code_r0x001046ee;
        local_58.data = &String::emptyData.super_Data;
        String::attach(&local_58,str,lVar5 - 1);
        local_80.data = &String::emptyData.super_Data;
        length = 0xffffffffffffffff;
        do {
          lVar2 = length + 1;
          length = length + 1;
        } while ((str + lVar5)[lVar2] != '\0');
        String::attach(&local_80,str + lVar5,length);
        Map<String,_String>::insert(in_RDI,&in_RDI->root,(Item *)0x0,&local_58,&local_80);
        if ((local_80.data)->ref != 0) {
          LOCK();
          puVar1 = &(local_80.data)->ref;
          *puVar1 = *puVar1 - 1;
          UNLOCK();
          if ((*puVar1 == 0) && (local_80.data != (Data *)0x0)) {
            operator_delete__(local_80.data);
          }
        }
        plVar3 = _environ;
        if ((local_58.data)->ref != 0) {
          LOCK();
          puVar1 = &(local_58.data)->ref;
          *puVar1 = *puVar1 - 1;
          UNLOCK();
          plVar3 = _environ;
          if ((*puVar1 == 0) && (local_58.data != (Data *)0x0)) {
            operator_delete__(local_58.data);
            plVar3 = _environ;
          }
        }
      }
LAB_001047a4:
      str = (char *)plVar3[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (str != (char *)0x0);
  }
  return in_RDI;
code_r0x001046ee:
  cVar4 = str[lVar5];
  lVar5 = lVar5 + 1;
  if (cVar4 == '\0') goto LAB_001047a4;
  goto LAB_001046e9;
}

Assistant:

Map<String, String> Process::getEnvironmentVariables()
{
#ifdef _WIN32
  Map<String, String> result;
  LPTCH environmentStrings = GetEnvironmentStrings();
  if (!environmentStrings)
    return result;
  struct Guard
  {
    LPTCH _environmentStrings;
    ~Guard() { FreeEnvironmentStrings(_environmentStrings); }
  } guard = { environmentStrings };

  for (LPTCH i = environmentStrings; *i != '\0'; ++i)
  {
    String key;
    String value;

    for (; *i != '='; ++i)
      key += *i;
    ++i;
    for (; *i != '\0'; ++i)
        value += *i;

    if (key.isEmpty())
      continue;
    result.insert(key, value);
  }
  return result;
#else
  Map<String, String> result;
  for (size_t i = 0; environ[i]; ++i)
  {
    const char* e = environ[i];
    const char* x = String::find(e, '=');
    if (!x)
      continue;
    String var;
    var.attach(e, x - e);
    String value;
    ++x;
    value.attach(x, String::length(x));
    result.insert(var, value);
  }
  return result;
#endif
}